

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

void __thiscall
kj::HashIndex<kj::_::(anonymous_namespace)::StringLengthCompare>::move<kj::StringPtr,unsigned_long>
          (HashIndex<kj::_::(anonymous_namespace)::StringLengthCompare> *this,
          ArrayPtr<kj::StringPtr> table,size_t oldPos,size_t newPos,unsigned_long *params)

{
  bool bVar1;
  uint hash;
  size_t sVar2;
  HashBucket *this_00;
  HashBucket *bucket;
  uint i;
  uint hashCode;
  unsigned_long *params_local;
  size_t newPos_local;
  size_t oldPos_local;
  HashIndex<kj::_::(anonymous_namespace)::StringLengthCompare> *this_local;
  ArrayPtr<kj::StringPtr> table_local;
  
  hash = kj::_::anon_unknown_0::StringLengthCompare::hashCode((StringLengthCompare *)this,*params);
  sVar2 = Array<kj::_::HashBucket>::size(&this->buckets);
  bucket._0_4_ = kj::_::chooseBucket(hash,(uint)sVar2);
  while( true ) {
    this_00 = Array<kj::_::HashBucket>::operator[](&this->buckets,(ulong)(uint)bucket);
    bVar1 = kj::_::HashBucket::isPos(this_00,(uint)oldPos);
    if (bVar1) {
      kj::_::HashBucket::setPos(this_00,(uint)newPos);
      return;
    }
    bVar1 = kj::_::HashBucket::isEmpty(this_00);
    if (bVar1) break;
    sVar2 = kj::_::probeHash(&this->buckets,(ulong)(uint)bucket);
    bucket._0_4_ = (uint)sVar2;
  }
  kj::_::logHashTableInconsistency();
  return;
}

Assistant:

void move(kj::ArrayPtr<Row> table, size_t oldPos, size_t newPos, Params&&... params) {
    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isPos(oldPos)) {
        // found it
        bucket.setPos(newPos);
        return;
      } else if (bucket.isEmpty()) {
        // can't find the bucket, something is very wrong
        _::logHashTableInconsistency();
        return;
      }
    }
  }